

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O0

int SUNLinSolSetScalingVectors_PCG(SUNLinearSolver S,N_Vector s,N_Vector nul)

{
  N_Vector nul_local;
  N_Vector s_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    *(N_Vector *)((long)S->content + 0x48) = s;
    *(undefined8 *)((long)S->content + 0x18) = 0;
    S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetScalingVectors_PCG(SUNLinearSolver S, N_Vector s,
                                   N_Vector nul)
{
  /* set N_Vector pointer to integrator-supplied scaling vector
     (only use the first one), and return with success */
  if (S == NULL) return(SUNLS_MEM_NULL);
  PCG_CONTENT(S)->s = s;
  LASTFLAG(S) = SUNLS_SUCCESS;
  return(LASTFLAG(S));
}